

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

UniValue * Parse(string_view raw)

{
  ssize_t sVar1;
  runtime_error *this;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  void *in_RDX;
  int in_ESI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  char local_58 [16];
  string local_48;
  UniValue *local_28;
  
  local_28 = *(UniValue **)(in_FS_OFFSET + 0x28);
  (in_RDI->val)._M_dataplus._M_p = (pointer)&(in_RDI->val).field_2;
  (in_RDI->val)._M_string_length = 0;
  (in_RDI->val).field_2._M_local_buf[0] = '\0';
  in_RDI->typ = VNULL;
  (in_RDI->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = UniValue::read(in_RDI,in_ESI,in_RDX,(size_t)in_RCX);
  if ((char)sVar1 == '\0') {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
              (&local_48,(tinyformat *)"Error parsing JSON: %s",local_58,in_RCX);
    std::runtime_error::runtime_error(this,(string *)&local_48);
    if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(UniValue **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static UniValue Parse(std::string_view raw)
{
    UniValue parsed;
    if (!parsed.read(raw)) throw std::runtime_error(tfm::format("Error parsing JSON: %s", raw));
    return parsed;
}